

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O1

void __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::dfs_blue
          (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this,zg_t *ts,
          graph_t *graph,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
          stats_t *stats,node_sptr_t *n)

{
  _Elt_pointer n_00;
  color_t cVar1;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  node_t *pnVar3;
  bool bVar4;
  color_t *pcVar5;
  unsigned_long *puVar6;
  bool *pbVar7;
  _Elt_pointer pbVar8;
  int iVar9;
  node_sptr_t t;
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>_>
  stack;
  undefined1 local_110 [40];
  _Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
  local_e8;
  blue_stack_entry_t local_90;
  
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_110._8_8_ = this;
  local_110._16_8_ = ts;
  local_110._24_8_ = graph;
  local_110._32_8_ = labels;
  std::
  _Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
  ::_M_initialize_map(&local_e8,0);
  if ((node_t *)n->_t == (node_t *)0x0) {
LAB_0013244d:
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1db,
                  "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>]"
                 );
  }
  pcVar5 = ndfs::node_t::color((node_t *)n->_t);
  *pcVar5 = CYAN;
  local_90.n._t =
       (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
        *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&local_90.n,n->_t);
  expand_node(&local_90.succ,
              (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *)
              local_110._8_8_,(zg_t *)local_110._16_8_,(graph_t *)local_110._24_8_,n,
              (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_110._32_8_);
  local_90.allred = true;
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>
            ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
              *)&local_e8,&local_90);
  std::
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~deque(&local_90.succ);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_90.n);
  puVar6 = stats_t::visited_states_blue(stats);
  *puVar6 = *puVar6 + 1;
  do {
    if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    pbVar8 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar8 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
    n_00 = pbVar8 + -1;
    if (pbVar8[-1].succ.
        super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        pbVar8[-1].succ.
        super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      pnVar3 = (node_t *)pbVar8[-1].n._t;
      if (pbVar8[-1].allred == true) {
        if (pnVar3 == (node_t *)0x0) goto LAB_0013244d;
        pcVar5 = ndfs::node_t::color(pnVar3);
LAB_00132318:
        *pcVar5 = RED;
      }
      else {
        if (pnVar3 == (node_t *)0x0) goto LAB_0013244d;
        if (((pnVar3->super_node_flags_t)._flags & (pnVar3->super_node_flags_t).NODE_FINAL) != 0) {
          dfs_red((algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *)
                  local_110._8_8_,(zg_t *)local_110._16_8_,(graph_t *)local_110._24_8_,
                  (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_110._32_8_,
                  stats,&n_00->n);
          pnVar3 = (node_t *)(n_00->n)._t;
          if (pnVar3 != (node_t *)0x0) {
            pcVar5 = ndfs::node_t::color(pnVar3);
            goto LAB_00132318;
          }
          goto LAB_0013244d;
        }
        pcVar5 = ndfs::node_t::color(pnVar3);
        *pcVar5 = BLUE;
      }
      pnVar3 = (node_t *)(n_00->n)._t;
      if (pnVar3 == (node_t *)0x0) goto LAB_0013244d;
      pcVar5 = ndfs::node_t::color(pnVar3);
      cVar1 = *pcVar5;
      std::
      deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
      ::pop_back((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
                  *)&local_e8);
      if ((cVar1 != RED) &&
         (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
        pbVar8 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar8 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
        }
        pbVar8[-1].allred = false;
      }
LAB_00132413:
      iVar9 = 0;
    }
    else {
      blue_stack_entry_t::pick_successor((blue_stack_entry_t *)local_110);
      puVar6 = stats_t::visited_transitions_blue(stats);
      *puVar6 = *puVar6 + 1;
      if ((node_t *)local_110._0_8_ == (node_t *)0x0) goto LAB_0013244d;
      pcVar5 = ndfs::node_t::color((node_t *)local_110._0_8_);
      if (*pcVar5 == CYAN) {
        pmVar2 = (n_00->n)._t;
        if (pmVar2 == (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                       *)0x0) goto LAB_0013244d;
        if (((pmVar2->
             super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
             ).super_node_t.super_node_t.super_node_flags_t._flags &
            (pmVar2->
            super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
            ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL) == 0) {
          if ((node_t *)local_110._0_8_ == (node_t *)0x0) goto LAB_0013244d;
          if (((((node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                  *)local_110._0_8_)->super_node_t).super_node_t.super_node_flags_t._flags &
              (((node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                 *)local_110._0_8_)->super_node_t).super_node_t.super_node_flags_t.NODE_FINAL) == 0)
          goto LAB_0013228a;
        }
        pbVar7 = stats_t::cycle(stats);
        *pbVar7 = true;
        bVar4 = false;
        iVar9 = 3;
      }
      else {
LAB_0013228a:
        if ((node_t *)local_110._0_8_ == (node_t *)0x0) goto LAB_0013244d;
        pcVar5 = ndfs::node_t::color((node_t *)local_110._0_8_);
        if (*pcVar5 == WHITE) {
          if ((node_t *)local_110._0_8_ == (node_t *)0x0) goto LAB_0013244d;
          pcVar5 = ndfs::node_t::color((node_t *)local_110._0_8_);
          *pcVar5 = CYAN;
          local_90.n._t =
               (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)0x0;
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::reset(&local_90.n,
                  (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                   *)local_110._0_8_);
          expand_node(&local_90.succ,
                      (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *)
                      local_110._8_8_,(zg_t *)local_110._16_8_,(graph_t *)local_110._24_8_,
                      (node_sptr_t *)local_110,
                      (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                      local_110._32_8_);
          local_90.allred = true;
          std::
          deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
          ::
          emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>
                    ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
                      *)&local_e8,&local_90);
          std::
          deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::~deque(&local_90.succ);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&local_90.n);
          puVar6 = stats_t::visited_states_blue(stats);
          *puVar6 = *puVar6 + 1;
          iVar9 = 0;
          bVar4 = true;
        }
        else {
          if ((node_t *)local_110._0_8_ == (node_t *)0x0) goto LAB_0013244d;
          pcVar5 = ndfs::node_t::color((node_t *)local_110._0_8_);
          bVar4 = true;
          iVar9 = 0;
          if (*pcVar5 != RED) {
            pbVar8[-1].allred = false;
            iVar9 = 0;
          }
        }
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)local_110);
      if (bVar4) goto LAB_00132413;
    }
  } while (iVar9 == 0);
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
  ::~deque((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
            *)&local_e8);
  return;
}

Assistant:

void dfs_blue(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels, tchecker::algorithms::ndfs::stats_t & stats,
                node_sptr_t & n)
  {
    std::stack<blue_stack_entry_t> stack;

    n->color() = tchecker::algorithms::ndfs::CYAN;
    stack.push(blue_stack_entry_t{n, expand_node(ts, graph, n, labels), true});
    ++stats.visited_states_blue();

    while (!stack.empty()) {
      auto && [s, succ, allred] = stack.top();
      if (succ.empty()) {
        if (allred)
          s->color() = tchecker::algorithms::ndfs::RED;
        else if (s->final()) {
          dfs_red(ts, graph, labels, stats, s);
          s->color() = tchecker::algorithms::ndfs::RED;
        }
        else
          s->color() = tchecker::algorithms::ndfs::BLUE;
        bool s_is_red = (s->color() == tchecker::algorithms::ndfs::RED);
        stack.pop();
        if (!s_is_red && !stack.empty())
          stack.top().allred = false;
      }
      else {
        node_sptr_t t = stack.top().pick_successor();
        ++stats.visited_transitions_blue();
        if (t->color() == tchecker::algorithms::ndfs::CYAN && (s->final() || t->final())) {
          stats.cycle() = true;
          break;
        }
        else if (t->color() == tchecker::algorithms::ndfs::WHITE) {
          t->color() = tchecker::algorithms::ndfs::CYAN;
          stack.push(blue_stack_entry_t{t, expand_node(ts, graph, t, labels), true});
          ++stats.visited_states_blue();
        }
        else if (t->color() != tchecker::algorithms::ndfs::RED)
          allred = false;
      }
    }
  }